

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall
r_comp::Decompiler::write_expression_tail
          (Decompiler *this,uint16_t read_index,bool apply_time_offset,bool vertical)

{
  byte bVar1;
  undefined4 in_EAX;
  undefined7 in_register_00000009;
  uint uVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  char *t;
  OutStream *this_00;
  ushort uVar4;
  bool bVar5;
  bool after_tail_wildcard;
  undefined8 uStack_38;
  
  uVar3 = CONCAT62(in_register_00000032,read_index) & 0xffffffff;
  uStack_38._0_4_ = in_EAX;
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),
             CONCAT62(in_register_00000032,read_index) & 0xffffffff);
  bVar1 = r_code::Atom::getAtomCount();
  uVar4 = (ushort)bVar1;
  uStack_38 = CONCAT44((int)CONCAT71(in_register_00000009,vertical),(undefined4)uStack_38) &
              0xffffffff00ffffff;
  do {
    while( true ) {
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) {
        return;
      }
      if (uStack_38._3_1_ != '\x01') break;
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      write_any(this,(uint16_t)uVar2,(bool *)((long)&uStack_38 + 3),apply_time_offset,0);
    }
    if (this->closing_set == true) {
      this->closing_set = false;
      if (this->horizontal_set == false) {
        write_indent(this,this->indents);
      }
      else {
        this_00 = this->out_stream;
        uStack_38._0_3_ = CONCAT12(0x20,(undefined2)uStack_38);
        t = (char *)((long)&uStack_38 + 2);
LAB_0013bf2e:
        OutStream::operator<<(this_00,t);
      }
    }
    else if (uStack_38._4_1_ == '\0') {
      this_00 = this->out_stream;
      uStack_38._0_2_ = CONCAT11(0x20,(undefined1)uStack_38);
      t = (char *)((long)&uStack_38 + 1);
      goto LAB_0013bf2e;
    }
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
    write_any(this,(uint16_t)uVar2,(bool *)((long)&uStack_38 + 3),apply_time_offset,0);
    if (this->closing_set == false && vertical) {
      OutStream::operator<<(this->out_stream,(char (*) [2])0x146232);
    }
  } while( true );
}

Assistant:

void Decompiler::write_expression_tail(uint16_t read_index, bool apply_time_offset, bool vertical)   // read_index points initially to the head.
{
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, apply_time_offset);
        } else {
            if (closing_set) {
                closing_set = false;

                if (!horizontal_set) {
                    write_indent(indents);
                } else {
                    *out_stream << ' ';
                }
            } else if (!vertical) {
                *out_stream << ' ';
            }

            write_any(++read_index, after_tail_wildcard, apply_time_offset);

            if (!closing_set && vertical) {
                *out_stream << "\n";
            }
        }
    }
}